

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O0

void __thiscall
netbase_tests::netbase_dont_resolve_strings_with_embedded_nul_characters::test_method
          (netbase_dont_resolve_strings_with_embedded_nul_characters *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  CSubNet *in_stack_fffffffffffff3c8;
  undefined7 in_stack_fffffffffffff3d0;
  undefined1 in_stack_fffffffffffff3d7;
  assertion_result *in_stack_fffffffffffff3d8;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_stack_fffffffffffff3e0;
  undefined7 in_stack_fffffffffffff3e8;
  undefined1 in_stack_fffffffffffff3ef;
  const_string *in_stack_fffffffffffff3f0;
  const_string *msg;
  size_t in_stack_fffffffffffff3f8;
  undefined1 *line_num;
  const_string *in_stack_fffffffffffff400;
  const_string *file;
  DNSLookupFn *in_stack_fffffffffffff408;
  undefined8 in_stack_fffffffffffff410;
  undefined7 in_stack_fffffffffffff418;
  undefined1 in_stack_fffffffffffff41f;
  string *in_stack_fffffffffffff460;
  string *subnet_str;
  const_string local_a08 [2];
  lazy_ostream local_9e8 [2];
  assertion_result local_9c8;
  const_string local_9b0;
  undefined1 local_9a0 [16];
  const_string local_990 [2];
  lazy_ostream local_970 [2];
  assertion_result local_950 [2];
  const_string local_918 [2];
  lazy_ostream local_8f8 [2];
  assertion_result local_8d8;
  string local_8c0;
  const_string local_8a0 [2];
  lazy_ostream local_880 [2];
  assertion_result local_860 [2];
  const_string local_828 [2];
  lazy_ostream local_808 [2];
  assertion_result local_7e8 [2];
  const_string local_7b0 [2];
  lazy_ostream local_790 [2];
  assertion_result local_770 [2];
  const_string local_738 [2];
  lazy_ostream local_718 [2];
  assertion_result local_6f8 [2];
  const_string local_6c0 [2];
  lazy_ostream local_6a0 [2];
  assertion_result local_680 [2];
  const_string local_648 [2];
  lazy_ostream local_628 [4];
  assertion_result local_5e8 [2];
  const_string local_5b0 [2];
  lazy_ostream local_590 [4];
  assertion_result local_550 [2];
  const_string local_518 [2];
  lazy_ostream local_4f8 [4];
  assertion_result local_4b8 [2];
  const_string local_480 [2];
  lazy_ostream local_460 [4];
  assertion_result local_420 [2];
  DNSLookupFn local_3e8 [31];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,
               in_stack_fffffffffffff3f8,in_stack_fffffffffffff3f0);
    s_abi_cxx11_((char *)in_stack_fffffffffffff408,(size_t)in_stack_fffffffffffff400);
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)CONCAT17(in_stack_fffffffffffff3ef,in_stack_fffffffffffff3e8),
               in_stack_fffffffffffff3e0);
    LookupHost((string *)CONCAT17(in_stack_fffffffffffff41f,in_stack_fffffffffffff418),
               SUB81((ulong)in_stack_fffffffffffff410 >> 0x38,0),in_stack_fffffffffffff408);
    std::optional<CNetAddr>::has_value((optional<CNetAddr> *)in_stack_fffffffffffff3c8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff3d8,(bool)in_stack_fffffffffffff3d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff3c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    in_stack_fffffffffffff3c8 = (CSubNet *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_420,local_460,local_480,0x1e0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff3c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff3c8);
    std::optional<CNetAddr>::~optional((optional<CNetAddr> *)in_stack_fffffffffffff3c8);
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::~function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                 *)in_stack_fffffffffffff3c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff3c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,
               in_stack_fffffffffffff3f8,in_stack_fffffffffffff3f0);
    s_abi_cxx11_((char *)in_stack_fffffffffffff408,(size_t)in_stack_fffffffffffff400);
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)CONCAT17(in_stack_fffffffffffff3ef,in_stack_fffffffffffff3e8),
               in_stack_fffffffffffff3e0);
    LookupHost((string *)CONCAT17(in_stack_fffffffffffff41f,in_stack_fffffffffffff418),
               SUB81((ulong)in_stack_fffffffffffff410 >> 0x38,0),in_stack_fffffffffffff408);
    std::optional<CNetAddr>::has_value((optional<CNetAddr> *)in_stack_fffffffffffff3c8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff3d8,(bool)in_stack_fffffffffffff3d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff3c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    in_stack_fffffffffffff3c8 = (CSubNet *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4b8,local_4f8,local_518,0x1e1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff3c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff3c8);
    std::optional<CNetAddr>::~optional((optional<CNetAddr> *)in_stack_fffffffffffff3c8);
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::~function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                 *)in_stack_fffffffffffff3c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff3c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,
               in_stack_fffffffffffff3f8,in_stack_fffffffffffff3f0);
    s_abi_cxx11_((char *)in_stack_fffffffffffff408,(size_t)in_stack_fffffffffffff400);
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)CONCAT17(in_stack_fffffffffffff3ef,in_stack_fffffffffffff3e8),
               in_stack_fffffffffffff3e0);
    LookupHost((string *)CONCAT17(in_stack_fffffffffffff41f,in_stack_fffffffffffff418),
               SUB81((ulong)in_stack_fffffffffffff410 >> 0x38,0),in_stack_fffffffffffff408);
    std::optional<CNetAddr>::has_value((optional<CNetAddr> *)in_stack_fffffffffffff3c8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff3d8,(bool)in_stack_fffffffffffff3d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff3c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    in_stack_fffffffffffff3c8 = (CSubNet *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_550,local_590,local_5b0,0x1e2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff3c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff3c8);
    std::optional<CNetAddr>::~optional((optional<CNetAddr> *)in_stack_fffffffffffff3c8);
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::~function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                 *)in_stack_fffffffffffff3c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff3c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,
               in_stack_fffffffffffff3f8,in_stack_fffffffffffff3f0);
    s_abi_cxx11_((char *)in_stack_fffffffffffff408,(size_t)in_stack_fffffffffffff400);
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)CONCAT17(in_stack_fffffffffffff3ef,in_stack_fffffffffffff3e8),
               in_stack_fffffffffffff3e0);
    LookupHost((string *)CONCAT17(in_stack_fffffffffffff41f,in_stack_fffffffffffff418),
               SUB81((ulong)in_stack_fffffffffffff410 >> 0x38,0),in_stack_fffffffffffff408);
    std::optional<CNetAddr>::has_value((optional<CNetAddr> *)in_stack_fffffffffffff3c8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff3d8,(bool)in_stack_fffffffffffff3d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff3c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    in_stack_fffffffffffff3c8 = (CSubNet *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5e8,local_628,local_648,0x1e3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff3c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff3c8);
    std::optional<CNetAddr>::~optional((optional<CNetAddr> *)in_stack_fffffffffffff3c8);
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::~function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                 *)in_stack_fffffffffffff3c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff3c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,
               in_stack_fffffffffffff3f8,in_stack_fffffffffffff3f0);
    s_abi_cxx11_((char *)in_stack_fffffffffffff408,(size_t)in_stack_fffffffffffff400);
    LookupSubNet(in_stack_fffffffffffff460);
    CSubNet::IsValid(in_stack_fffffffffffff3c8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff3d8,(bool)in_stack_fffffffffffff3d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff3c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    in_stack_fffffffffffff3c8 = (CSubNet *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_680,local_6a0,local_6c0,0x1e5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff3c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff3c8);
    CSubNet::~CSubNet(in_stack_fffffffffffff3c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff3c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,
               in_stack_fffffffffffff3f8,in_stack_fffffffffffff3f0);
    s_abi_cxx11_((char *)in_stack_fffffffffffff408,(size_t)in_stack_fffffffffffff400);
    LookupSubNet(in_stack_fffffffffffff460);
    CSubNet::IsValid(in_stack_fffffffffffff3c8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff3d8,(bool)in_stack_fffffffffffff3d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff3c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    in_stack_fffffffffffff3c8 = (CSubNet *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6f8,local_718,local_738,0x1e6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff3c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff3c8);
    CSubNet::~CSubNet(in_stack_fffffffffffff3c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff3c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,
               in_stack_fffffffffffff3f8,in_stack_fffffffffffff3f0);
    s_abi_cxx11_((char *)in_stack_fffffffffffff408,(size_t)in_stack_fffffffffffff400);
    LookupSubNet(in_stack_fffffffffffff460);
    CSubNet::IsValid(in_stack_fffffffffffff3c8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff3d8,(bool)in_stack_fffffffffffff3d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff3c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    in_stack_fffffffffffff3c8 = (CSubNet *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_770,local_790,local_7b0,0x1e7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff3c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff3c8);
    CSubNet::~CSubNet(in_stack_fffffffffffff3c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff3c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,
               in_stack_fffffffffffff3f8,in_stack_fffffffffffff3f0);
    s_abi_cxx11_((char *)in_stack_fffffffffffff408,(size_t)in_stack_fffffffffffff400);
    LookupSubNet(in_stack_fffffffffffff460);
    CSubNet::IsValid(in_stack_fffffffffffff3c8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff3d8,(bool)in_stack_fffffffffffff3d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff3c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    in_stack_fffffffffffff3c8 = (CSubNet *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7e8,local_808,local_828,0x1e8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff3c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff3c8);
    CSubNet::~CSubNet(in_stack_fffffffffffff3c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff3c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,
               in_stack_fffffffffffff3f8,in_stack_fffffffffffff3f0);
    s_abi_cxx11_((char *)in_stack_fffffffffffff408,(size_t)in_stack_fffffffffffff400);
    LookupSubNet(in_stack_fffffffffffff460);
    CSubNet::IsValid(in_stack_fffffffffffff3c8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff3d8,(bool)in_stack_fffffffffffff3d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff3c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    in_stack_fffffffffffff3c8 = (CSubNet *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_860,local_880,local_8a0,0x1e9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff3c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff3c8);
    CSubNet::~CSubNet(in_stack_fffffffffffff3c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff3c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    subnet_str = &local_8c0;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,
               in_stack_fffffffffffff3f8,in_stack_fffffffffffff3f0);
    s_abi_cxx11_((char *)in_stack_fffffffffffff408,(size_t)in_stack_fffffffffffff400);
    LookupSubNet(subnet_str);
    CSubNet::IsValid(in_stack_fffffffffffff3c8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff3d8,(bool)in_stack_fffffffffffff3d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff3c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    in_stack_fffffffffffff3c8 = (CSubNet *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_8d8,local_8f8,local_918,0x1ea,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff3c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff3c8);
    CSubNet::~CSubNet(in_stack_fffffffffffff3c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff3c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,
               in_stack_fffffffffffff3f8,in_stack_fffffffffffff3f0);
    s_abi_cxx11_((char *)in_stack_fffffffffffff408,(size_t)in_stack_fffffffffffff400);
    LookupSubNet(subnet_str);
    CSubNet::IsValid(in_stack_fffffffffffff3c8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff3d8,(bool)in_stack_fffffffffffff3d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff3c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    in_stack_fffffffffffff3c8 = (CSubNet *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_950,local_970,local_990,0x1eb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff3c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff3c8);
    CSubNet::~CSubNet(in_stack_fffffffffffff3c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff3c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    line_num = local_9a0;
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    file = &local_9b0;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff408,file,(size_t)line_num,msg);
    in_stack_fffffffffffff408 = local_3e8;
    s_abi_cxx11_((char *)in_stack_fffffffffffff408,(size_t)file);
    LookupSubNet(subnet_str);
    CSubNet::IsValid(in_stack_fffffffffffff3c8);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffff3d8,(bool)in_stack_fffffffffffff3d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff3c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3d8,
               (pointer)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
               (unsigned_long)in_stack_fffffffffffff3c8);
    in_stack_fffffffffffff3c8 = (CSubNet *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_9c8,local_9e8,local_a08,0x1ec,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff3c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff3c8);
    CSubNet::~CSubNet(in_stack_fffffffffffff3c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff3c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(netbase_dont_resolve_strings_with_embedded_nul_characters)
{
    BOOST_CHECK(LookupHost("127.0.0.1"s, false).has_value());
    BOOST_CHECK(!LookupHost("127.0.0.1\0"s, false).has_value());
    BOOST_CHECK(!LookupHost("127.0.0.1\0example.com"s, false).has_value());
    BOOST_CHECK(!LookupHost("127.0.0.1\0example.com\0"s, false).has_value());

    BOOST_CHECK(LookupSubNet("1.2.3.0/24"s).IsValid());
    BOOST_CHECK(!LookupSubNet("1.2.3.0/24\0"s).IsValid());
    BOOST_CHECK(!LookupSubNet("1.2.3.0/24\0example.com"s).IsValid());
    BOOST_CHECK(!LookupSubNet("1.2.3.0/24\0example.com\0"s).IsValid());
    BOOST_CHECK(LookupSubNet("pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion"s).IsValid());
    BOOST_CHECK(!LookupSubNet("pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion\0"s).IsValid());
    BOOST_CHECK(!LookupSubNet("pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion\0example.com"s).IsValid());
    BOOST_CHECK(!LookupSubNet("pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion\0example.com\0"s).IsValid());
}